

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary.h
# Opt level: O3

vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
* __thiscall
lf::mesh::utils::internal::OperatorMultiplication::operator()
          (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,OperatorMultiplication *this,
          vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          *u,vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *v,int param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  double dVar4;
  pointer pMVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  pointer pMVar9;
  ulong uVar10;
  long lVar11;
  pointer pMVar12;
  long lVar13;
  stringstream ss;
  string local_248;
  string local_228;
  string local_208;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1e8;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *local_1c8;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_1c0;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> local_1b8
  ;
  ostream local_1a8 [376];
  
  local_1c8 = __return_storage_ptr__;
  local_1c0 = v;
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::vector(&local_1e8,
           (long)(u->
                 super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(u->
                 super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_1b8);
  pMVar12 = (u->
            super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((u->
      super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar12) {
    lVar13 = 0;
    lVar11 = 0;
    uVar10 = 0;
    do {
      pMVar5 = (local_1c0->
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows + lVar11) != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"#cols of lhs doesn\'t match #rows of rhs",0x27);
        paVar1 = &local_228.field_2;
        local_228._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"u[i].cols() == v[i].rows()","");
        paVar2 = &local_248.field_2;
        local_248._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_228,&local_248,0x1df,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        local_228._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"false","");
        local_248._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
                   ,"");
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
        base::AssertionFailed(&local_228,&local_248,0x1df,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_228);
        abort();
      }
      Eigen::
      Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
      Product(&local_1b8,
              (Lhs *)((long)(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                            m_storage.m_data.array + lVar13),
              (Rhs *)((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             ).m_storage.m_data + lVar11));
      pMVar9 = local_1e8.
               super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Eigen::
      Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
      Product((Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
               *)&local_1b8,local_1b8.m_lhs,local_1b8.m_rhs);
      pdVar6 = ((local_1b8.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      dVar3 = *pdVar6;
      dVar4 = pdVar6[1];
      dVar7 = ((local_1b8.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
              m_storage.m_data.array[1];
      dVar8 = ((local_1b8.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
              m_storage.m_data.array[3];
      pdVar6 = (double *)
               ((long)(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                      m_storage.m_data.array + lVar11);
      *pdVar6 = dVar4 * ((local_1b8.m_lhs)->
                        super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                        m_data.array[2] +
                dVar3 * ((local_1b8.m_lhs)->
                        super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                        m_data.array[0];
      pdVar6[1] = dVar4 * dVar8 + dVar3 * dVar7;
      uVar10 = uVar10 + 1;
      pMVar12 = (u->
                super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
      lVar13 = lVar13 + 0x20;
    } while (uVar10 < (ulong)((long)(u->
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >> 5
                             ));
  }
  (local_1c8->
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_1e8.
       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_1c8->
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_1e8.
       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_1c8->
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1e8.
       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return local_1c8;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S1, R1, C1, O1, MR1, MC1>>& u,
                  const std::vector<Eigen::Matrix<S2, R2, C2, O2, MR2, MC2>>& v,
                  int /*unused*/) const {
    using scalar_t = decltype(S1(0) * S2(0));                      // NOLINT
    if constexpr (R1 != Eigen::Dynamic && C2 != Eigen::Dynamic) {  // NOLINT
      // The result is fixed size
      static_assert(C1 == Eigen::Dynamic || R2 == Eigen::Dynamic || C1 == R2,
                    "#cols of lhs doesn't match #rows of rhs");

      std::vector<Eigen::Matrix<scalar_t, R1, C2>> result(u.size());
      for (std::size_t i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(u[i].cols() == v[i].rows(),
                      "#cols of lhs doesn't match #rows of rhs");
        result[i] = u[i] * v[i];
      }
      return result;
    } else {  // NOLINT
      // multiply dynamic sized matrices
      std::vector<Eigen::Matrix<scalar_t, Eigen::Dynamic, Eigen::Dynamic>>
          result;
      result.reserve(u.size());
      for (int i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(u[i].cols() == v[i].rows(),
                      "#cols of lhs doesn't match #rows of rhs");
        result.emplace_back(u[i] * v[i]);
      }
      return result;
    }
  }